

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QNetworkCacheMetaDataPrivate>::reset
          (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *this,QNetworkCacheMetaDataPrivate *ptr)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != ptr) {
    if (ptr != (QNetworkCacheMetaDataPrivate *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar1 != (QNetworkCacheMetaDataPrivate *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&pQVar1->attributes);
        QHttpHeaders::~QHttpHeaders(&pQVar1->headers);
        QDateTime::~QDateTime(&pQVar1->expirationDate);
        QDateTime::~QDateTime(&pQVar1->lastModified);
        QUrl::~QUrl(&pQVar1->url);
        operator_delete(pQVar1,0x38);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }